

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Statement * __thiscall SQCompilation::SQParser::parseStatement(SQParser *this,bool closeframe)

{
  long lVar1;
  SQInteger SVar2;
  SQUnsignedInteger SVar3;
  bool bVar4;
  int iVar5;
  SwitchStatement *pSVar6;
  Expr *pEVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  lVar1 = this->_token;
  iVar10 = (int)(this->_lex)._tokenline;
  iVar9 = (int)(this->_lex)._tokencolumn;
  switch(lVar1) {
  case 0x10c:
    pSVar6 = parseSwitchStatement(this);
    break;
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x111:
  case 0x116:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11c:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x126:
switchD_00152ec5_caseD_10d:
    pEVar7 = Expression(this,SQE_REGULAR);
    pSVar6 = (SwitchStatement *)
             newNode<SQCompilation::ExprStatement,SQCompilation::Expr*>(this,pEVar7);
    iVar9 = (pEVar7->super_Node)._coordinates.columnStart;
    iVar10 = (pEVar7->super_Node)._coordinates.lineEnd;
    iVar8 = (pEVar7->super_Node)._coordinates.columnEnd;
    (pSVar6->super_Statement).super_Node._coordinates.lineStart =
         (pEVar7->super_Node)._coordinates.lineStart;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar9;
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd = iVar10;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = iVar8;
    goto LAB_0015315c;
  case 0x110:
    pSVar6 = (SwitchStatement *)parseIfStatement(this);
    break;
  case 0x112:
    pSVar6 = (SwitchStatement *)parseWhileStatement(this);
    break;
  case 0x113:
    pSVar6 = (SwitchStatement *)
             newNode<SQCompilation::BreakStatement,decltype(nullptr)>(this,(void *)0x0);
    (pSVar6->super_Statement).super_Node._coordinates.lineStart = iVar10;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar9;
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    goto LAB_0015315c;
  case 0x114:
    pSVar6 = (SwitchStatement *)parseForStatement(this);
    break;
  case 0x115:
    pSVar6 = (SwitchStatement *)parseDoWhileStatement(this);
    break;
  case 0x117:
    pSVar6 = (SwitchStatement *)parseForEachStatement(this);
    break;
  case 0x11b:
switchD_00152ec5_caseD_11b:
    pSVar6 = (SwitchStatement *)parseLocalDeclStatement(this);
    break;
  case 0x11d:
    pSVar6 = (SwitchStatement *)parseLocalFunctionDeclStmt(this,false);
    break;
  case 0x11e:
  case 0x124:
    SVar2 = (this->_lex)._currentline;
    iVar8 = (int)(this->_lex)._currentcolumn;
    Lex(this);
    bVar4 = IsEndOfStatement(this);
    if (bVar4) {
      pEVar7 = (Expr *)0x0;
    }
    else {
      pEVar7 = Expression(this,SQE_RVALUE);
    }
    if (lVar1 == 0x11e) {
      pSVar6 = (SwitchStatement *)
               newNode<SQCompilation::ReturnStatement,SQCompilation::Expr*>(this,pEVar7);
    }
    else {
      pSVar6 = (SwitchStatement *)
               newNode<SQCompilation::YieldStatement,SQCompilation::Expr*>(this,pEVar7);
    }
    if (pEVar7 == (Expr *)0x0) {
      iVar5 = (int)SVar2;
    }
    else {
      iVar8 = (pEVar7->super_Node)._coordinates.columnStart;
      (pSVar6->super_Statement).super_Node._coordinates.lineStart =
           (pEVar7->super_Node)._coordinates.lineStart;
      (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar8;
      iVar5 = (pEVar7->super_Node)._coordinates.lineEnd;
      iVar8 = (pEVar7->super_Node)._coordinates.columnEnd;
    }
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd = iVar5;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = iVar8;
    goto LAB_001531b4;
  case 0x123:
    pSVar6 = (SwitchStatement *)
             newNode<SQCompilation::ContinueStatement,decltype(nullptr)>(this,(void *)0x0);
    (pSVar6->super_Statement).super_Node._coordinates.lineStart = iVar10;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar9;
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    goto LAB_0015315c;
  case 0x125:
    pSVar6 = (SwitchStatement *)parseTryCatchStatement(this);
    break;
  case 0x127:
    Lex(this);
    pEVar7 = Expression(this,SQE_RVALUE);
    pSVar6 = (SwitchStatement *)
             newNode<SQCompilation::ThrowStatement,SQCompilation::Expr*>(this,pEVar7);
    iVar8 = (pEVar7->super_Node)._coordinates.columnEnd;
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd =
         (pEVar7->super_Node)._coordinates.lineEnd;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = iVar8;
LAB_001531b4:
    (pSVar6->super_Statement).super_Node._coordinates.lineStart = iVar10;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar9;
    goto LAB_0015315c;
  default:
    bVar4 = false;
    switch(lVar1) {
    case 0x143:
switchD_00152f4e_caseD_143:
      pSVar6 = (SwitchStatement *)parseEnumStatement(this,bVar4);
      break;
    case 0x144:
switchD_00152f4e_caseD_144:
      pSVar6 = (SwitchStatement *)parseConstStatement(this,bVar4);
      break;
    case 0x145:
    case 0x146:
    case 0x147:
    case 0x148:
    case 0x149:
    case 0x14a:
      goto switchD_00152ec5_caseD_10d;
    case 0x14b:
      Lex(this);
      bVar4 = true;
      if (this->_token == 0x143) goto switchD_00152f4e_caseD_143;
      if (this->_token == 0x144) goto switchD_00152f4e_caseD_144;
      pSVar6 = (SwitchStatement *)0x0;
      reportDiagnostic(this,0x17);
      break;
    case 0x14c:
      pSVar6 = (SwitchStatement *)parseDirectiveStatement(this);
      break;
    default:
      if (lVar1 == 0x3b) {
        pSVar6 = (SwitchStatement *)newNode<SQCompilation::EmptyStatement>(this);
        Lex(this);
      }
      else if (lVar1 == 0x7b) {
        SVar3 = this->_lang_features;
        Lex(this);
        pSVar6 = (SwitchStatement *)parseStatements(this);
        Expect(this,0x7d);
        this->_lang_features = SVar3;
      }
      else {
        if (lVar1 != 0x133) {
          if (lVar1 == 0x150) goto switchD_00152ec5_caseD_11b;
          goto switchD_00152ec5_caseD_10d;
        }
        pSVar6 = (SwitchStatement *)parseLocalClassDeclStmt(this,false);
      }
    }
  }
  (pSVar6->super_Statement).super_Node._coordinates.lineStart = iVar10;
  (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar9;
  (pSVar6->super_Statement).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
  (pSVar6->super_Statement).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
LAB_0015315c:
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return &pSVar6->super_Statement;
}

Assistant:

Statement* SQParser::parseStatement(bool closeframe)
{
    NestingChecker nc(this);
    Statement *result = NULL;
    SQInteger l = line(), c = column();

    switch(_token) {
    case _SC(';'):  result = newNode<EmptyStatement>(); Lex(); break;
    case TK_DIRECTIVE:  result = parseDirectiveStatement();    break;
    case TK_IF:     result = parseIfStatement();          break;
    case TK_WHILE:  result = parseWhileStatement();       break;
    case TK_DO:     result = parseDoWhileStatement();     break;
    case TK_FOR:    result = parseForStatement();         break;
    case TK_FOREACH:result = parseForEachStatement();     break;
    case TK_SWITCH: result = parseSwitchStatement();      break;
    case TK_LOCAL:
    case TK_LET:
        result = parseLocalDeclStatement();
        break;
    case TK_RETURN:
    case TK_YIELD: {
        SQOpcode op;
        if(_token == TK_RETURN) {
            op = _OP_RETURN;
        }
        else {
            op = _OP_YIELD;
        }
        SQInteger le = _lex._currentline;
        SQInteger ce = _lex._currentcolumn;
        Lex();

        Expr *arg = NULL;
        if(!IsEndOfStatement()) {
            arg = Expression(SQE_RVALUE);
        }

        result = op == _OP_RETURN ? static_cast<TerminateStatement *>(newNode<ReturnStatement>(arg)) : newNode<YieldStatement>(arg);
        if (arg) {
            copyCoordinates(arg, result);
        }
        else {
            result->setLineEndPos(le);
            result->setColumnEndPos(ce);
        }

        result->setLineStartPos(l);
        result->setColumnStartPos(c);

        return result;
    }
    case TK_BREAK:
        result = setCoordinates(newNode<BreakStatement>(nullptr), l, c);
        Lex();
        return result;
    case TK_CONTINUE:
        result = setCoordinates(newNode<ContinueStatement>(nullptr), l, c);
        Lex();
        return result;
    case TK_FUNCTION:
        result = parseLocalFunctionDeclStmt(false);
        break;
    case TK_CLASS:
        result = parseLocalClassDeclStmt(false);
        break;
    case TK_ENUM:
        result = parseEnumStatement(false);
        break;
    case _SC('{'):
    {
        SQUnsignedInteger savedLangFeatures = _lang_features;
        Lex();
        result = parseStatements();
        Expect(_SC('}'));
        _lang_features = savedLangFeatures;
        break;
    }
    case TK_TRY:
        result = parseTryCatchStatement();
        break;
    case TK_THROW: {
        Lex();
        Expr *e = Expression(SQE_RVALUE);
        result = copyCoordinates(e, newNode<ThrowStatement>(e));
        result->setLineStartPos(l); result->setColumnStartPos(c);
        return result;
    }
    case TK_CONST:
        result = parseConstStatement(false);
        break;
    case TK_GLOBAL:
        Lex();
        if (_token == TK_CONST)
            result = parseConstStatement(true);
        else if (_token == TK_ENUM)
            result = parseEnumStatement(true);
        else
            reportDiagnostic(DiagnosticsId::DI_GLOBAL_CONSTS_ONLY);
        break;
    default: {
        Expr *e = Expression(SQE_REGULAR);
        return copyCoordinates(e, newNode<ExprStatement>(e));
      }
    }

    setCoordinates(result, l, c);

    assert(result);
    return result;
}